

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuadaptor_p.cpp
# Opt level: O2

void __thiscall
QDBusMenuAdaptor::qt_static_metacall(QDBusMenuAdaptor *this,QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 *puVar1;
  PrivateShared *pPVar2;
  undefined1 *puVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *puVar6;
  undefined4 in_register_0000000c;
  QtMocHelpers *this_00;
  InterfaceType *pIVar7;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  QDBusVariant *local_18;
  
  this_00 = (QtMocHelpers *)CONCAT44(in_register_0000000c,_id);
  local_18 = *(QDBusVariant **)(in_FS_OFFSET + 0x28);
  switch((ulong)_o & 0xffffffff) {
  case 0:
    switch(_c) {
    case InvokeMetaMethod:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        ItemActivationRequested(this,**(int **)(this_00 + 8),**(uint **)(this_00 + 0x10));
        return;
      }
      goto LAB_0058950a;
    case ReadProperty:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        ItemsPropertiesUpdated
                  (this,*(QDBusMenuItemList **)(this_00 + 8),
                   *(QDBusMenuItemKeysList **)(this_00 + 0x10));
        return;
      }
      goto LAB_0058950a;
    case WriteProperty:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        LayoutUpdated(this,**(uint **)(this_00 + 8),**(int **)(this_00 + 0x10));
        return;
      }
      goto LAB_0058950a;
    case ResetProperty:
      AboutToShow(this,**(int **)(this_00 + 8));
      if (*(undefined1 **)this_00 != (undefined1 *)0x0) {
        **(undefined1 **)this_00 = 0;
      }
      break;
    case CreateInstance:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      AboutToShowGroup((QList<int> *)&local_38,this,*(QList<int> **)(this_00 + 8),
                       *(QList<int> **)(this_00 + 0x10));
      goto LAB_0058949d;
    case IndexOfMethod:
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        Event(this,**(int **)(this_00 + 8),*(QString **)(this_00 + 0x10),
              *(QDBusVariant **)(in_FS_OFFSET + 0x28),(uint)_a);
        return;
      }
      goto LAB_0058950a;
    case RegisterPropertyMetaType:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      EventGroup((QList<int> *)&local_38,this,*(QDBusMenuEventList **)(this_00 + 8));
LAB_0058949d:
      if (*(QArrayDataPointer<int> **)this_00 != (QArrayDataPointer<int> *)0x0) {
        QArrayDataPointer<int>::operator=
                  (*(QArrayDataPointer<int> **)this_00,(QArrayDataPointer<int> *)&local_38);
      }
      QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_38);
      break;
    case RegisterMethodArgumentMetaType:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      GetGroupProperties((QDBusMenuItemList *)&local_38,
                         (QDBusMenuAdaptor *)&switchD_00589169::switchdataD_00617bb0,
                         *(QList<int> **)(this_00 + 8),*(QStringList **)(this_00 + 0x10));
      if (*(QArrayDataPointer<QDBusMenuItem> **)this_00 != (QArrayDataPointer<QDBusMenuItem> *)0x0)
      {
        QArrayDataPointer<QDBusMenuItem>::operator=
                  (*(QArrayDataPointer<QDBusMenuItem> **)this_00,
                   (QArrayDataPointer<QDBusMenuItem> *)&local_38);
      }
      QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
                ((QArrayDataPointer<QDBusMenuItem> *)&local_38);
      break;
    case BindableProperty:
      uVar5 = GetLayout(this,**(int **)(this_00 + 8),**(int **)(this_00 + 0x10),
                        *(QStringList **)(this_00 + 0x18),*(QDBusMenuLayoutItem **)(this_00 + 0x20))
      ;
      if (*(uint **)this_00 != (uint *)0x0) {
        **(uint **)this_00 = uVar5;
      }
      break;
    case CustomCall:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      GetProperty((QDBusVariant *)&local_38,
                  (QDBusMenuAdaptor *)&switchD_00589169::switchdataD_00617bb0,
                  **(int **)(this_00 + 8),*(QString **)(this_00 + 0x10));
      if (*(QVariant **)this_00 != (QVariant *)0x0) {
        ::QVariant::operator=(*(QVariant **)this_00,(QVariant *)&local_38);
      }
      ::QVariant::~QVariant((QVariant *)&local_38);
    }
    break;
  case 1:
    puVar6 = *(undefined8 **)this_00;
    if (_c == WriteProperty) {
      *(undefined4 *)puVar6 = 4;
    }
    else {
      if (_c == ReadProperty) {
        textDirection((QString *)&local_38,
                      (QDBusMenuAdaptor *)&switchD_00589169::switchdataD_00617bb0);
      }
      else {
        if (_c != InvokeMetaMethod) break;
        status((QString *)&local_38,(QDBusMenuAdaptor *)&switchD_00589169::switchdataD_00617bb0);
      }
      pPVar2 = (PrivateShared *)*puVar6;
      puVar3 = (undefined1 *)puVar6[1];
      *puVar6 = local_38.shared;
      puVar6[1] = local_38._8_8_;
      puVar1 = (undefined1 *)puVar6[2];
      puVar6[2] = local_38._16_8_;
      local_38.shared = pPVar2;
      local_38._8_8_ = puVar3;
      local_38._16_8_ = puVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    }
    break;
  case 5:
    bVar4 = QtMocHelpers::indexOfMethod<void(QDBusMenuAdaptor::*)(int,unsigned_int)>
                      (this_00,(void **)ItemActivationRequested,0,0);
    if ((!bVar4) &&
       (bVar4 = QtMocHelpers::
                indexOfMethod<void(QDBusMenuAdaptor::*)(QList<QDBusMenuItem>const&,QList<QDBusMenuItemKeys>const&)>
                          (this_00,(void **)ItemsPropertiesUpdated,0,1), !bVar4)) {
      if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QDBusMenuAdaptor::*)(unsigned_int,int)>
                  (this_00,(void **)LayoutUpdated,0,2);
        return;
      }
      goto LAB_0058950a;
    }
    break;
  case 7:
    switch(_c) {
    case ReadProperty:
      puVar6 = *(undefined8 **)this_00;
      if (**(int **)(this_00 + 8) == 0) {
        pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
      }
      else {
        if (**(int **)(this_00 + 8) != 1) goto LAB_00589312;
        pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
      }
      break;
    default:
      puVar6 = *(undefined8 **)this_00;
LAB_00589312:
      *puVar6 = 0;
      goto switchD_00589169_caseD_2;
    case CreateInstance:
    case RegisterMethodArgumentMetaType:
      puVar6 = *(undefined8 **)this_00;
      if (**(int **)(this_00 + 8) != 0) goto LAB_00589312;
      pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
      break;
    case IndexOfMethod:
      puVar6 = *(undefined8 **)this_00;
      if (**(int **)(this_00 + 8) != 2) goto LAB_00589312;
      pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
      break;
    case RegisterPropertyMetaType:
      puVar6 = *(undefined8 **)this_00;
      if (**(int **)(this_00 + 8) != 0) goto LAB_00589312;
      pIVar7 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuEvent>_>::metaType;
    }
    *puVar6 = pIVar7;
  }
switchD_00589169_caseD_2:
  if (*(QDBusVariant **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0058950a:
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuAdaptor *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ItemActivationRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 1: _t->ItemsPropertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->LayoutUpdated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: { bool _r = _t->AboutToShow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 4: { QList<int> _r = _t->AboutToShowGroup((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<int>&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->Event((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[4]))); break;
        case 6: { QList<int> _r = _t->EventGroup((*reinterpret_cast< std::add_pointer_t<QDBusMenuEventList>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QList<int>*>(_a[0]) = std::move(_r); }  break;
        case 7: { QDBusMenuItemList _r = _t->GetGroupProperties((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusMenuItemList*>(_a[0]) = std::move(_r); }  break;
        case 8: { uint _r = _t->GetLayout((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuLayoutItem&>>(_a[4])));
            if (_a[0]) *reinterpret_cast< uint*>(_a[0]) = std::move(_r); }  break;
        case 9: { QDBusVariant _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuEventList >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(int , uint )>(_a, &QDBusMenuAdaptor::ItemActivationRequested, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(const QDBusMenuItemList & , const QDBusMenuItemKeysList & )>(_a, &QDBusMenuAdaptor::ItemsPropertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuAdaptor::*)(uint , int )>(_a, &QDBusMenuAdaptor::LayoutUpdated, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->status(); break;
        case 1: *reinterpret_cast<QString*>(_v) = _t->textDirection(); break;
        case 2: *reinterpret_cast<uint*>(_v) = _t->version(); break;
        default: break;
        }
    }
}